

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O0

ssize_t __thiscall StaticContentsSock::Recv(StaticContentsSock *this,void *buf,size_t len,int flags)

{
  long lVar1;
  size_t __n;
  unsigned_long *puVar2;
  char *pcVar3;
  uint in_ECX;
  void *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  size_t consume_bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  unsigned_long *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (in_stack_ffffffffffffffa8);
  puVar2 = std::min<unsigned_long>
                     (in_stack_ffffffffffffffb0,(unsigned_long *)in_stack_ffffffffffffffa8);
  __n = *puVar2;
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (in_stack_ffffffffffffffa8);
  memcpy(in_RSI,pcVar3 + *(long *)(in_RDI + 0x30),__n);
  if ((in_ECX & 2) == 0) {
    *(size_t *)(in_RDI + 0x30) = __n + *(long *)(in_RDI + 0x30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __n;
  }
  __stack_chk_fail();
}

Assistant:

ssize_t Recv(void* buf, size_t len, int flags) const override
    {
        const size_t consume_bytes{std::min(len, m_contents.size() - m_consumed)};
        std::memcpy(buf, m_contents.data() + m_consumed, consume_bytes);
        if ((flags & MSG_PEEK) == 0) {
            m_consumed += consume_bytes;
        }
        return consume_bytes;
    }